

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall Matrix::LowerTriangular(Matrix *this)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = this->rowNo;
  if (0 < (long)iVar1) {
    uVar2 = this->colNo;
    uVar4 = 0;
    do {
      if (0 < (int)uVar2) {
        ppdVar3 = this->array;
        uVar5 = 0;
        do {
          if (uVar4 < uVar5) {
            ppdVar3[uVar4][uVar5] = 0.0;
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (long)iVar1);
  }
  return;
}

Assistant:

void Matrix::LowerTriangular()
{
    for (int i = 0; i < rowNo; i++)
    {
        for (int j = 0; j < colNo; j++)
        {
            if (i < j)
            {
                array[i][j] = 0;
            }
        }
    }

}